

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_run_compression_cpp(bool copy_on_write)

{
  bool bVar1;
  char *expression;
  byte in_DIL;
  uint64_t size_removed;
  bool removed;
  uint64_t size_optimized;
  bool has_run;
  uint64_t size_origin;
  uint32_t i;
  Roaring r1;
  undefined8 in_stack_ffffffffffffff88;
  int line;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar2;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  Roaring *in_stack_ffffffffffffffa8;
  uint local_34;
  undefined1 local_30 [47];
  byte local_1;
  
  local_1 = in_DIL & 1;
  roaring::Roaring::Roaring
            ((Roaring *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  roaring::Roaring::setCopyOnWrite
            ((Roaring *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
  for (local_34 = 100; local_34 < 0x2711; local_34 = local_34 + 1) {
    roaring::Roaring::add
              ((Roaring *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  }
  uVar2 = 1;
  roaring::Roaring::getSizeInBytes
            (in_stack_ffffffffffffffa8,SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0));
  roaring::Roaring::runOptimize((Roaring *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
  roaring::Roaring::getSizeInBytes
            (in_stack_ffffffffffffffa8,SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0));
  line = (int)((ulong)local_30 >> 0x20);
  _assert_true(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff90),line);
  _assert_true(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff90),line);
  bVar1 = roaring::Roaring::removeRunCompression
                    ((Roaring *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa0);
  _assert_true(CONCAT44(in_stack_ffffffffffffffa4,uVar3),in_stack_ffffffffffffff98,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffff90),line);
  expression = (char *)roaring::Roaring::getSizeInBytes
                                 (in_stack_ffffffffffffffa8,
                                  SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0));
  _assert_true(CONCAT44(in_stack_ffffffffffffffa4,uVar3),expression,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffff90),line);
  roaring::Roaring::~Roaring((Roaring *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void test_run_compression_cpp(bool copy_on_write) {
    Roaring r1;
    r1.setCopyOnWrite(copy_on_write);
    for (uint32_t i = 100; i <= 10000; i++) {
        r1.add(i);
    }
    uint64_t size_origin = r1.getSizeInBytes();
    bool has_run = r1.runOptimize();
    uint64_t size_optimized = r1.getSizeInBytes();
    assert_true(has_run);
    assert_true(size_origin > size_optimized);
    bool removed = r1.removeRunCompression();
    assert_true(removed);
    uint64_t size_removed = r1.getSizeInBytes();
    assert_true(size_removed > size_optimized);
    return;
}